

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_declaration.c
# Opt level: O1

mpc_val_t * fold_declaration(int n,mpc_val_t **xs)

{
  undefined4 *__ptr;
  undefined4 *__ptr_00;
  mpc_val_t *pmVar1;
  int iVar2;
  long *plVar3;
  undefined1 *puVar4;
  
  __ptr = (undefined4 *)*xs;
  __ptr_00 = (undefined4 *)xs[6];
  plVar3 = (long *)malloc(0x28);
  pmVar1 = xs[1];
  *plVar3 = (long)pmVar1;
  *(undefined4 *)(plVar3 + 1) = 0;
  plVar3[2] = (long)xs[3];
  plVar3[3] = (long)xs[4];
  *(undefined4 *)(plVar3 + 4) = *__ptr;
  *(undefined4 *)((long)plVar3 + 0x24) = *__ptr_00;
  if ((char *)xs[2] != (char *)0x0) {
    iVar2 = strcmp((char *)xs[2],"typedef");
    if (iVar2 == 0) {
      *(undefined4 *)(plVar3 + 1) = 1;
    }
  }
  if (pmVar1 == (mpc_val_t *)0x0) {
    puVar4 = (undefined1 *)malloc(1);
    *puVar4 = 0;
    *plVar3 = (long)puVar4;
  }
  free(__ptr);
  free(xs[2]);
  free(xs[5]);
  free(__ptr_00);
  return plVar3;
}

Assistant:

static mpc_val_t *fold_declaration(int n, mpc_val_t **xs)
{
    mpc_state_t *start_state = xs[0];
    mpc_state_t *end_state = xs[6];

    c_declaration_t *declaration = malloc(sizeof(c_declaration_t));
    declaration->doc = xs[1];
    declaration->storage_class = C_STORAGE_CLASS_NONE;
    declaration->type_specifier = xs[3];
    declaration->declarator = xs[4];
    declaration->position_start = start_state->pos;
    declaration->position_end = end_state->pos;

    if (xs[2] != NULL && strcmp(xs[2], "typedef") == 0) {
        declaration->storage_class = C_STORAGE_CLASS_TYPEDEF;
    }

    if (declaration->doc == NULL) {
        char *doc = malloc(1);
        doc[0] = '\0';
        declaration->doc = doc;
    }

    free(start_state);
    free(xs[2]);
    free(xs[5]);
    free(end_state);

    return declaration;
}